

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall SuiteTimeRangeTests::TestisInRange::RunImpl(TestisInRange *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_90;
  UtcTimeStamp now;
  UtcTimeOnly end;
  UtcTimeOnly start;
  
  FIX::UtcTimeOnly::UtcTimeOnly(&start,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly(&end,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&now.super_DateTime,10,0,0,10,10,2000);
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x2a);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"TimeRange::isInRange( start, end, now )")
    ;
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,0x12,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x2d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"TimeRange::isInRange( start, end, now )")
    ;
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,2,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x30);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_90,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,0x13,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x33);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_90,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,0x12,0,1,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x36);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_90,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_90,0x12,0,0,0);
  start.super_DateTime._8_8_ = local_90.testName;
  start.super_DateTime.m_time = (int64_t)local_90.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_90,3,0,0,0);
  end.super_DateTime._8_8_ = local_90.testName;
  end.super_DateTime.m_time = (int64_t)local_90.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,0x12,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x3b);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"TimeRange::isInRange( start, end, now )")
    ;
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,3,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x3e);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_90,"TimeRange::isInRange( start, end, now )")
    ;
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,4,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x41);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_90,"!TimeRange::isInRange( start, end, now )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_90,0x11,0,0,10,10,2000);
  now.super_DateTime._8_8_ = local_90.testName;
  now.super_DateTime.m_time = (int64_t)local_90.filename;
  bVar2 = FIX::TimeRange::isInRange(&start,&end,&now.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_90,*ppTVar4,0x44);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_90,"!TimeRange::isInRange( start, end, now )");
  }
  return;
}

Assistant:

TEST(isInRange)
{
  UtcTimeOnly start( 3, 0, 0 );
  UtcTimeOnly end( 18, 0, 0 );

  UtcTimeStamp now( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 18, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 2, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 18, 0, 1, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  start = UtcTimeOnly( 18, 0, 0 );
  end = UtcTimeOnly( 3, 0, 0 );
  now = UtcTimeStamp( 18, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 3, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 4, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );

  now = UtcTimeStamp( 17, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInRange( start, end, now ) );
}